

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::ubjson::
basic_ubjson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
::visit_begin_array(basic_ubjson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
                    *this,size_t length,semantic_tag param_3,ser_context *param_4,error_code *ec)

{
  int iVar1;
  int iVar2;
  bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *in_RDI;
  error_code *in_R8;
  size_t in_stack_00000048;
  basic_ubjson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
  *in_stack_00000050;
  uint8_t in_stack_ffffffffffffffbf;
  ubjson_errc in_stack_ffffffffffffffcc;
  
  iVar2 = *(int *)&in_RDI[9].buf_ptr + 1;
  *(int *)&in_RDI[9].buf_ptr = iVar2;
  iVar1 = ubjson_options_common::max_nesting_depth
                    ((ubjson_options_common *)
                     ((long)&in_RDI[2].buf_ptr +
                     (long)in_RDI[2].buf_ptr[-1].
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start));
  if (iVar1 < iVar2) {
    std::error_code::operator=(in_R8,in_stack_ffffffffffffffcc);
  }
  else {
    std::
    vector<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,std::allocator<char>>::stack_item,std::allocator<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,std::allocator<char>>::stack_item>>
    ::emplace_back<jsoncons::ubjson::ubjson_container_type,unsigned_long&>
              ((vector<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item>_>
                *)in_R8,(ubjson_container_type *)CONCAT44(2,iVar2),(unsigned_long *)in_RDI);
    bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>::push_back
              (in_RDI,in_stack_ffffffffffffffbf);
    bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>::push_back
              (in_RDI,in_stack_ffffffffffffffbf);
    put_length(in_stack_00000050,in_stack_00000048);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_array(std::size_t length, semantic_tag, const ser_context&, std::error_code& ec) override
    {
        if (JSONCONS_UNLIKELY(++nesting_depth_ > options_.max_nesting_depth()))
        {
            ec = ubjson_errc::max_nesting_depth_exceeded;
            JSONCONS_VISITOR_RETURN;
        } 
        stack_.emplace_back(ubjson_container_type::array, length);
        sink_.push_back(jsoncons::ubjson::ubjson_type::start_array_marker);
        sink_.push_back(jsoncons::ubjson::ubjson_type::count_marker);
        put_length(length);

        JSONCONS_VISITOR_RETURN;
    }